

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<prometheus::MetricType> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ParamGenerator<prometheus::MetricType> PVar2;
  __normal_iterator<const_prometheus::MetricType_*,_std::vector<prometheus::MetricType,_std::allocator<prometheus::MetricType>_>_>
  local_28;
  __normal_iterator<const_prometheus::MetricType_*,_std::vector<prometheus::MetricType,_std::allocator<prometheus::MetricType>_>_>
  local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  ValueArray<prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType>
  ::MakeVector<prometheus::MetricType,0ul,1ul,2ul,3ul,4ul,5ul>(&local_28);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<prometheus::MetricType_const*,std::vector<prometheus::MetricType,std::allocator<prometheus::MetricType>>>>
                    ((testing *)this,local_28,local_20);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28._M_current != (MetricType *)0x0) {
    operator_delete(local_28._M_current);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<prometheus::MetricType>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }